

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  pointer pfVar1;
  pointer pfVar2;
  int64_t iVar3;
  long lVar4;
  float extraout_XMM0_Da;
  
  iVar3 = Matrix::size(A,0);
  if (iVar3 != (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    __assert_fail("A.size(0) == size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/vector.cc"
                  ,0x46,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
  }
  iVar3 = Matrix::size(A,1);
  if (iVar3 == (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pfVar1 != pfVar2 && -1 < (long)pfVar1 - (long)pfVar2) {
      lVar4 = 0;
      do {
        (*A->_vptr_Matrix[2])(A,vec,lVar4);
        pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar1[lVar4] = extraout_XMM0_Da;
        lVar4 = lVar4 + 1;
      } while (lVar4 < (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)pfVar1 >> 2);
    }
    return;
  }
  __assert_fail("A.size(1) == vec.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/vector.cc"
                ,0x47,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.size(0) == size());
  assert(A.size(1) == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}